

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void __thiscall QOpenGL2PaintEngineExPrivate::resetClipIfNeeded(QOpenGL2PaintEngineExPrivate *this)

{
  QOpenGL2PaintEngineState *pQVar1;
  QOpenGL2PaintEngineExPrivate *in_RDI;
  long in_FS_OFFSET;
  float l;
  float fVar2;
  qreal qVar3;
  QOpenGL2PaintEngineEx *q;
  QOpenGLRect rect;
  QRectF bounds;
  GLenum in_stack_ffffffffffffff28;
  GLboolean in_stack_ffffffffffffff2c;
  GLboolean alpha;
  GLboolean in_stack_ffffffffffffff2d;
  GLboolean blue;
  GLboolean in_stack_ffffffffffffff2e;
  GLboolean green;
  GLboolean in_stack_ffffffffffffff2f;
  GLboolean red;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  QOpenGLRect local_a8;
  QRectF local_98;
  QRectF local_78;
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->maxClip == 0x7f) {
    q_func(in_RDI);
    useSimpleShader((QOpenGL2PaintEngineExPrivate *)
                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    QOpenGLFunctions::glEnable
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               CONCAT13(in_stack_ffffffffffffff2f,
                        CONCAT12(in_stack_ffffffffffffff2e,
                                 CONCAT11(in_stack_ffffffffffffff2d,in_stack_ffffffffffffff2c))));
    QOpenGLFunctions::glColorMask
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2f,in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2d,
               in_stack_ffffffffffffff2c);
    local_78.xp = -NAN;
    local_78.yp = -NAN;
    local_78.w = -NAN;
    local_78.h = -NAN;
    QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x16111f);
    QTransform::inverted(local_58);
    QRectF::QRectF(&local_98,0.0,0.0,(double)in_RDI->width,(double)in_RDI->height);
    QTransform::mapRect((QRectF *)&local_78);
    local_a8.left = -NAN;
    local_a8.top = -NAN;
    local_a8.right = -NAN;
    local_a8.bottom = -NAN;
    qVar3 = QRectF::left(&local_78);
    l = (float)qVar3;
    qVar3 = QRectF::top(&local_78);
    fVar2 = (float)qVar3;
    alpha = SUB41(fVar2,0);
    blue = (GLboolean)((uint)fVar2 >> 8);
    green = (GLboolean)((uint)fVar2 >> 0x10);
    red = (GLboolean)((uint)fVar2 >> 0x18);
    qVar3 = QRectF::right(&local_78);
    fVar2 = (float)qVar3;
    qVar3 = QRectF::bottom(&local_78);
    QOpenGLRect::QOpenGLRect
              (&local_a8,l,(GLfloat)CONCAT13(red,CONCAT12(green,CONCAT11(blue,alpha))),fVar2,
               (float)qVar3);
    QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x161211);
    QOpenGLFunctions::glStencilFunc
              ((QOpenGLFunctions *)CONCAT44(l,fVar2),
               CONCAT13(red,CONCAT12(green,CONCAT11(blue,alpha))),in_stack_ffffffffffffff28,0);
    QOpenGLFunctions::glStencilOp
              ((QOpenGLFunctions *)CONCAT44(l,fVar2),
               CONCAT13(red,CONCAT12(green,CONCAT11(blue,alpha))),in_stack_ffffffffffffff28,0);
    QOpenGLFunctions::glStencilMask
              ((QOpenGLFunctions *)CONCAT44(l,fVar2),
               CONCAT13(red,CONCAT12(green,CONCAT11(blue,alpha))));
    composite((QOpenGL2PaintEngineExPrivate *)CONCAT44(l,fVar2),
              (QOpenGLRect *)
              CONCAT17(red,CONCAT16(green,CONCAT15(blue,CONCAT14(alpha,in_stack_ffffffffffffff28))))
             );
    QOpenGLFunctions::glStencilFunc
              ((QOpenGLFunctions *)CONCAT44(l,fVar2),
               CONCAT13(red,CONCAT12(green,CONCAT11(blue,alpha))),in_stack_ffffffffffffff28,0);
    QOpenGLFunctions::glStencilOp
              ((QOpenGLFunctions *)CONCAT44(l,fVar2),
               CONCAT13(red,CONCAT12(green,CONCAT11(blue,alpha))),in_stack_ffffffffffffff28,0);
    QOpenGLFunctions::glStencilMask
              ((QOpenGLFunctions *)CONCAT44(l,fVar2),
               CONCAT13(red,CONCAT12(green,CONCAT11(blue,alpha))));
    composite((QOpenGL2PaintEngineExPrivate *)CONCAT44(l,fVar2),
              (QOpenGLRect *)
              CONCAT17(red,CONCAT16(green,CONCAT15(blue,CONCAT14(alpha,in_stack_ffffffffffffff28))))
             );
    pQVar1 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x1612df);
    *(uint *)&pQVar1->field_0x1c0 = *(uint *)&pQVar1->field_0x1c0 & 0xfffe01ff | 0x200;
    pQVar1 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x161301);
    *(uint *)&pQVar1->field_0x1c0 = *(uint *)&pQVar1->field_0x1c0 & 0xfffffff7;
    in_RDI->maxClip = 1;
    QOpenGLFunctions::glStencilMask
              ((QOpenGLFunctions *)CONCAT44(l,fVar2),
               CONCAT13(red,CONCAT12(green,CONCAT11(blue,alpha))));
    QOpenGLFunctions::glColorMask((QOpenGLFunctions *)CONCAT44(l,fVar2),red,green,blue,alpha);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::resetClipIfNeeded()
{
    if (maxClip != (GL_STENCIL_HIGH_BIT - 1))
        return;

    Q_Q(QOpenGL2PaintEngineEx);

    useSimpleShader();
    funcs.glEnable(GL_STENCIL_TEST);
    funcs.glColorMask(GL_FALSE, GL_FALSE, GL_FALSE, GL_FALSE);

    QRectF bounds = q->state()->matrix.inverted().mapRect(QRectF(0, 0, width, height));
    QOpenGLRect rect(bounds.left(), bounds.top(), bounds.right(), bounds.bottom());

    // Set high bit on clip region
    funcs.glStencilFunc(GL_LEQUAL, q->state()->currentClip, 0xff);
    funcs.glStencilOp(GL_KEEP, GL_INVERT, GL_INVERT);
    funcs.glStencilMask(GL_STENCIL_HIGH_BIT);
    composite(rect);

    // Reset clipping to 1 and everything else to zero
    funcs.glStencilFunc(GL_NOTEQUAL, 0x01, GL_STENCIL_HIGH_BIT);
    funcs.glStencilOp(GL_ZERO, GL_REPLACE, GL_REPLACE);
    funcs.glStencilMask(0xff);
    composite(rect);

    q->state()->currentClip = 1;
    q->state()->canRestoreClip = false;

    maxClip = 1;

    funcs.glStencilMask(0x0);
    funcs.glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
}